

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factorgraph.cpp
# Opt level: O1

void libDAI::RemoveShortLoops
               (vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *P)

{
  TFactor<double> *pTVar1;
  pointer pVVar2;
  TFactor<double> *this;
  pointer pVVar3;
  Var *n;
  bool bVar4;
  iterator __position;
  VarSet local_50;
  
  do {
    this = (P->
           super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
    if (this == (P->
                super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                )._M_impl.super__Vector_impl_data._M_finish) {
      __position._M_current = (TFactor<double> *)0x0;
      bVar4 = false;
    }
    else {
      bVar4 = false;
      do {
        pTVar1 = this + 1;
        __position._M_current = pTVar1;
        if (pTVar1 != (P->
                      super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish) {
          do {
            VarSet::operator&(&local_50,&this->_vs,&(__position._M_current)->_vs);
            pVVar2 = local_50._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
            pVVar3 = local_50._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            if (local_50._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl
                .super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_50._vars.
                              super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                              super__Vector_impl_data._M_start,
                              (long)local_50._vars.
                                    super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_50._vars.
                                    super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
            }
            if (0x10 < (ulong)((long)pVVar2 - (long)pVVar3)) {
              bVar4 = true;
              break;
            }
            __position._M_current = __position._M_current + 1;
          } while (__position._M_current !=
                   (P->
                   super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish);
        }
      } while ((!bVar4) &&
              (this = pTVar1,
              pTVar1 != (P->
                        super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish));
    }
    if (!bVar4) {
      return;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Merging factors ",0x10);
    for (pVVar3 = (this->_vs)._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pVVar3 != (this->_vs)._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                  _M_impl.super__Vector_impl_data._M_finish; pVVar3 = pVVar3 + 1) {
      operator<<((ostream *)&std::cout,pVVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," and ",5);
    for (n = ((__position._M_current)->_vs)._vars.
             super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
             super__Vector_impl_data._M_start;
        n != ((__position._M_current)->_vs)._vars.
             super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
             super__Vector_impl_data._M_finish; n = n + 1) {
      operator<<((ostream *)&std::cout,n);
    }
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
    std::ostream::put(-0x50);
    std::ostream::flush();
    TFactor<double>::operator*=(this,__position._M_current);
    std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::_M_erase
              (P,__position);
    if (!bVar4) {
      return;
    }
  } while( true );
}

Assistant:

void RemoveShortLoops(std::vector<Factor> &P) {
        bool found = true;
        while( found ) {
            found = false;
            vector<Factor>::iterator I, J;
            for( I = P.begin(); I != P.end(); I++ ) {
                J = I;
                J++;
                for( ; J != P.end(); J++ )
                    if( (I->vars() & J->vars()).size() >= 2 ) {
                        found = true;
                        break;
                    }
                if( found )
                    break;
            }
            if( found ) {
                cout << "Merging factors " << I->vars() << " and " << J->vars() << endl;
                *I *= *J;
                P.erase(J);
            }
        }
    }